

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O2

idx_t __thiscall
duckdb::ListColumnData::ScanCount
          (ListColumnData *this,ColumnScanState *state,Vector *result,idx_t count,
          idx_t result_offset)

{
  unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true> *this_00;
  PhysicalType PVar1;
  sel_t *psVar2;
  idx_t iVar3;
  idx_t iVar4;
  int iVar5;
  idx_t count_00;
  reference pvVar6;
  pointer pCVar7;
  undefined4 extraout_var;
  InternalException *pIVar8;
  ulong uVar9;
  long *plVar10;
  long lVar11;
  ColumnData *pCVar12;
  idx_t iVar13;
  idx_t iVar14;
  long lVar15;
  allocator local_141;
  Vector *local_140;
  ListColumnData *local_138;
  vector<duckdb::ColumnScanState,_true> *local_130;
  idx_t local_128;
  ulong local_120;
  LogicalType local_118;
  UnifiedVectorFormat offsets;
  string local_b8;
  Vector offset_vector;
  
  if (result_offset != 0) {
    pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&offset_vector,
               "ListColumnData::ScanCount not supported with result_offset > 0",
               (allocator *)&offsets);
    InternalException::InternalException(pIVar8,(string *)&offset_vector);
    __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (count == 0) {
    count_00 = 0;
  }
  else {
    LogicalType::LogicalType(&local_118,UBIGINT);
    Vector::Vector(&offset_vector,&local_118,count);
    pCVar12 = (ColumnData *)&local_118;
    LogicalType::~LogicalType((LogicalType *)pCVar12);
    count_00 = ColumnData::ScanVector(pCVar12,state,&offset_vector,count,SCAN_FLAT_VECTOR,0);
    pCVar12 = (ColumnData *)&state->child_states;
    local_130 = (vector<duckdb::ColumnScanState,_true> *)pCVar12;
    pvVar6 = vector<duckdb::ColumnScanState,_true>::get<true>
                       ((vector<duckdb::ColumnScanState,_true> *)pCVar12,0);
    ColumnData::ScanCount(pCVar12,pvVar6,result,count,0);
    UnifiedVectorFormat::UnifiedVectorFormat(&offsets);
    Vector::ToUnifiedFormat(&offset_vector,count_00,&offsets);
    psVar2 = (offsets.sel)->sel_vector;
    if (psVar2 == (sel_t *)0x0) {
      uVar9 = count_00 - 1;
    }
    else {
      uVar9 = (ulong)psVar2[count_00 - 1];
    }
    iVar3 = *(idx_t *)(offsets.data + uVar9 * 8);
    iVar4 = state->last_offset;
    plVar10 = (long *)(result->data + 8);
    lVar11 = 0;
    for (iVar13 = 0; count_00 != iVar13; iVar13 = iVar13 + 1) {
      iVar14 = iVar13;
      if (psVar2 != (sel_t *)0x0) {
        iVar14 = (idx_t)psVar2[iVar13];
      }
      plVar10[-1] = lVar11;
      lVar15 = (*(long *)(offsets.data + iVar14 * 8) - lVar11) - iVar4;
      *plVar10 = lVar15;
      lVar11 = lVar11 + lVar15;
      plVar10 = plVar10 + 2;
    }
    iVar13 = iVar3 - iVar4;
    local_138 = this;
    ListVector::Reserve(result,iVar13);
    if (iVar3 != iVar4) {
      local_140 = ListVector::GetEntry(result);
      PVar1 = (local_140->type).physical_type_;
      if ((PVar1 != STRUCT) && (PVar1 != ARRAY)) {
        pvVar6 = vector<duckdb::ColumnScanState,_true>::get<true>(local_130,1);
        local_120 = pvVar6->row_index + iVar13;
        this_00 = &local_138->child_column;
        pCVar7 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
                 operator->(this_00);
        local_128 = pCVar7->start;
        pCVar7 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
                 operator->(this_00);
        iVar5 = (*pCVar7->_vptr_ColumnData[3])(pCVar7);
        if (CONCAT44(extraout_var,iVar5) + local_128 < local_120) {
          pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_b8,
                     "ListColumnData::ScanCount - internal list scan offset is out of range",
                     &local_141);
          InternalException::InternalException(pIVar8,&local_b8);
          __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      pCVar7 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
               operator->(&local_138->child_column);
      pvVar6 = vector<duckdb::ColumnScanState,_true>::get<true>(local_130,1);
      (*pCVar7->_vptr_ColumnData[0xc])(pCVar7,pvVar6,local_140,iVar13,0);
    }
    state->last_offset = iVar3;
    ListVector::SetListSize(result,iVar13);
    UnifiedVectorFormat::~UnifiedVectorFormat(&offsets);
    Vector::~Vector(&offset_vector);
  }
  return count_00;
}

Assistant:

idx_t ListColumnData::ScanCount(ColumnScanState &state, Vector &result, idx_t count, idx_t result_offset) {
	if (result_offset > 0) {
		throw InternalException("ListColumnData::ScanCount not supported with result_offset > 0");
	}
	if (count == 0) {
		return 0;
	}
	// updates not supported for lists
	D_ASSERT(!updates);

	Vector offset_vector(LogicalType::UBIGINT, count);
	idx_t scan_count = ScanVector(state, offset_vector, count, ScanVectorType::SCAN_FLAT_VECTOR);
	D_ASSERT(scan_count > 0);
	validity.ScanCount(state.child_states[0], result, count);

	UnifiedVectorFormat offsets;
	offset_vector.ToUnifiedFormat(scan_count, offsets);
	auto data = UnifiedVectorFormat::GetData<uint64_t>(offsets);
	auto last_entry = data[offsets.sel->get_index(scan_count - 1)];

	// shift all offsets so they are 0 at the first entry
	auto result_data = FlatVector::GetData<list_entry_t>(result);
	auto base_offset = state.last_offset;
	idx_t current_offset = 0;
	for (idx_t i = 0; i < scan_count; i++) {
		auto offset_index = offsets.sel->get_index(i);
		result_data[i].offset = current_offset;
		result_data[i].length = data[offset_index] - current_offset - base_offset;
		current_offset += result_data[i].length;
	}

	D_ASSERT(last_entry >= base_offset);
	idx_t child_scan_count = last_entry - base_offset;
	ListVector::Reserve(result, child_scan_count);

	if (child_scan_count > 0) {
		auto &child_entry = ListVector::GetEntry(result);
		if (child_entry.GetType().InternalType() != PhysicalType::STRUCT &&
		    child_entry.GetType().InternalType() != PhysicalType::ARRAY &&
		    state.child_states[1].row_index + child_scan_count > child_column->start + child_column->GetMaxEntry()) {
			throw InternalException("ListColumnData::ScanCount - internal list scan offset is out of range");
		}
		child_column->ScanCount(state.child_states[1], child_entry, child_scan_count);
	}
	state.last_offset = last_entry;

	ListVector::SetListSize(result, child_scan_count);
	return scan_count;
}